

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O0

void __thiscall
llvm::raw_fd_ostream::raw_fd_ostream(raw_fd_ostream *this,int fd,bool shouldClose,bool unbuffered)

{
  uint64_t uVar1;
  off_t loc;
  bool unbuffered_local;
  bool shouldClose_local;
  int fd_local;
  raw_fd_ostream *this_local;
  
  raw_pwrite_stream::raw_pwrite_stream((raw_pwrite_stream *)this,unbuffered);
  *(undefined ***)this = &PTR__raw_fd_ostream_004391c0;
  this->FD = fd;
  this->ShouldClose = shouldClose;
  std::error_code::error_code(&this->EC);
  if (this->FD < 0) {
    this->ShouldClose = false;
  }
  else {
    if (this->FD < 3) {
      this->ShouldClose = false;
    }
    uVar1 = lseek(this->FD,0,1);
    this->SupportsSeeking = uVar1 != 0xffffffffffffffff;
    if ((this->SupportsSeeking & 1U) == 0) {
      this->pos = 0;
    }
    else {
      this->pos = uVar1;
    }
  }
  return;
}

Assistant:

raw_fd_ostream::raw_fd_ostream(int fd, bool shouldClose, bool unbuffered)
    : raw_pwrite_stream(unbuffered), FD(fd), ShouldClose(shouldClose) {
  if (FD < 0 ) {
    ShouldClose = false;
    return;
  }

  // Do not attempt to close stdout or stderr. We used to try to maintain the
  // property that tools that support writing file to stdout should not also
  // write informational output to stdout, but in practice we were never able to
  // maintain this invariant. Many features have been added to LLVM and clang
  // (-fdump-record-layouts, optimization remarks, etc) that print to stdout, so
  // users must simply be aware that mixed output and remarks is a possibility.
  if (FD <= STDERR_FILENO)
    ShouldClose = false;

  // Get the starting position.
  off_t loc = ::lseek(FD, 0, SEEK_CUR);
#ifdef _WIN32
  // MSVCRT's _lseek(SEEK_CUR) doesn't return -1 for pipes.
  sys::fs::file_status Status;
  std::error_code EC = status(FD, Status);
  SupportsSeeking = !EC && Status.type() == sys::fs::file_type::regular_file;
#else
  SupportsSeeking = loc != (off_t)-1;
#endif
  if (!SupportsSeeking)
    pos = 0;
  else
    pos = static_cast<uint64_t>(loc);
}